

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O0

Value * soul::performIntrinsic
                  (Value *__return_storage_ptr__,IntrinsicType i,ArrayView<soul::Value> args)

{
  IntrinsicType IVar1;
  bool bVar2;
  Value *pVVar3;
  Type *pTVar4;
  undefined1 in_R9B;
  ArrayView<soul::Value> args_00;
  Type local_258;
  ArrayView<soul::Value> local_240;
  undefined1 local_230 [8];
  Value result;
  Value *a_1;
  Value *__end1_1;
  Value *__begin1_1;
  ArrayView<soul::Value> *__range1_1;
  ArrayWithPreallocation<soul::Value,_4UL> castArgs;
  Type *t;
  Value *a;
  Value *__end1;
  Value *__begin1;
  ArrayView<soul::Value> *__range1;
  Type argType;
  undefined1 auStack_20 [4];
  IntrinsicType i_local;
  ArrayView<soul::Value> args_local;
  
  args_local.s = args.e;
  _auStack_20 = args.s;
  argType.structure.object._4_4_ = i;
  args_local.e = __return_storage_ptr__;
  pVVar3 = ArrayView<soul::Value>::front((ArrayView<soul::Value> *)auStack_20);
  pTVar4 = Value::getType(pVVar3);
  Type::Type((Type *)&__range1,pTVar4);
  __end1 = ArrayView<soul::Value>::begin((ArrayView<soul::Value> *)auStack_20);
  pVVar3 = ArrayView<soul::Value>::end((ArrayView<soul::Value> *)auStack_20);
  do {
    if (__end1 == pVVar3) {
      ArrayWithPreallocation<soul::Value,_4UL>::ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range1_1);
      __end1_1 = ArrayView<soul::Value>::begin((ArrayView<soul::Value> *)auStack_20);
      pVVar3 = ArrayView<soul::Value>::end((ArrayView<soul::Value> *)auStack_20);
      for (; IVar1 = argType.structure.object._4_4_, __end1_1 != pVVar3; __end1_1 = __end1_1 + 1) {
        Value::castToTypeExpectingSuccess
                  ((Value *)result.allocatedData.allocatedData.space,__end1_1,(Type *)&__range1);
        ArrayWithPreallocation<soul::Value,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range1_1,
                   (Value *)result.allocatedData.allocatedData.space);
        Value::~Value((Value *)result.allocatedData.allocatedData.space);
      }
      ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,4ul>>
                (&local_240,(ArrayWithPreallocation<soul::Value,_4UL> *)&__range1_1);
      bVar2 = Type::isFloatingPoint((Type *)&__range1);
      args_00.e._0_1_ = bVar2;
      args_00.s = local_240.e;
      args_00.e._1_7_ = 0;
      CompileTimeIntrinsicEvaluation::perform
                ((Value *)local_230,(CompileTimeIntrinsicEvaluation *)(ulong)IVar1,
                 (IntrinsicType)local_240.s,args_00,(bool)in_R9B);
      bVar2 = Value::isValid((Value *)local_230);
      if (bVar2) {
        pTVar4 = Value::getType((Value *)local_230);
        bVar2 = Type::isBool(pTVar4);
        if (bVar2) {
          Value::Value(__return_storage_ptr__,(Value *)local_230);
        }
        else {
          Type::withConstAndRefFlags(&local_258,(Type *)&__range1,false,false);
          Value::castToTypeExpectingSuccess(__return_storage_ptr__,(Value *)local_230,&local_258);
          Type::~Type(&local_258);
        }
      }
      else {
        Value::Value(__return_storage_ptr__);
      }
      castArgs.space[0x1f]._0_4_ = 1;
      Value::~Value((Value *)local_230);
      ArrayWithPreallocation<soul::Value,_4UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range1_1);
LAB_003a2e59:
      Type::~Type((Type *)&__range1);
      return __return_storage_ptr__;
    }
    pTVar4 = Value::getType(__end1);
    bVar2 = Type::isPrimitiveInteger(pTVar4);
    if (!bVar2) {
      bVar2 = Type::isPrimitiveFloat(pTVar4);
      if (!bVar2) {
        Value::Value(__return_storage_ptr__);
        castArgs.space[0x1f]._0_4_ = 1;
        goto LAB_003a2e59;
      }
    }
    bVar2 = TypeRules::canPassAsArgumentTo((Type *)&__range1,pTVar4,false);
    if (!bVar2) {
      Type::operator=((Type *)&__range1,pTVar4);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

Value performIntrinsic (IntrinsicType i, ArrayView<Value> args)
{
    auto argType = args.front().getType();

    for (auto& a : args)
    {
        const auto& t = a.getType();

        if (! (t.isPrimitiveInteger() || t.isPrimitiveFloat()))
            return {};

        if (! TypeRules::canPassAsArgumentTo (argType, t, false))
            argType = t;
    }

    ArrayWithPreallocation<Value, 4> castArgs;

    for (auto& a : args)
        castArgs.push_back (a.castToTypeExpectingSuccess (argType));

    auto result = CompileTimeIntrinsicEvaluation::perform (i, castArgs, argType.isFloatingPoint());

    if (! result.isValid())
        return {};

    if (result.getType().isBool())
        return result;

    return result.castToTypeExpectingSuccess (argType.withConstAndRefFlags (false, false));
}